

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

int ftpcccmethod(OperationConfig *config,char *str)

{
  int iVar1;
  int iVar2;
  
  iVar1 = curl_strequal("passive");
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar1 = curl_strequal("active",str);
    iVar2 = 2;
    if (iVar1 == 0) {
      warnf(config->global,"unrecognized ftp CCC method \'%s\', using default\n",str);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int ftpcccmethod(struct OperationConfig *config, const char *str)
{
  if(curl_strequal("passive", str))
    return CURLFTPSSL_CCC_PASSIVE;
  if(curl_strequal("active", str))
    return CURLFTPSSL_CCC_ACTIVE;

  warnf(config->global, "unrecognized ftp CCC method '%s', using default\n",
        str);

  return CURLFTPSSL_CCC_PASSIVE;
}